

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_IterSmallAndLargeMix::_Run(_Test_IterSmallAndLargeMix *this)

{
  SpecialEnv *pSVar1;
  pointer pcVar2;
  DB *pDVar3;
  int iVar4;
  undefined4 extraout_var;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  Env *local_1b8;
  Logger *pLStack_1b0;
  Iterator *iter;
  
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x38e);
  std::__cxx11::string::string((string *)&local_220,"a",&local_221);
  std::__cxx11::string::string((string *)local_1d8,"va",&local_1f9);
  DBTest::Put((DBTest *)local_1f8,(string *)this,&local_220);
  test::Tester::IsOk((Tester *)&local_1b8,(Status *)local_1f8);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x38f);
  std::__cxx11::string::string((string *)&local_220,"b",&local_221);
  pSVar1 = (SpecialEnv *)(local_1d8 + 0x10);
  local_1d8._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,-0x60);
  DBTest::Put((DBTest *)local_1f8,(string *)this,&local_220);
  test::Tester::IsOk((Tester *)&local_1b8,(Status *)local_1f8);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x390);
  std::__cxx11::string::string((string *)&local_220,"c",&local_221);
  std::__cxx11::string::string((string *)local_1d8,"vc",&local_1f9);
  DBTest::Put((DBTest *)local_1f8,(string *)this,&local_220);
  test::Tester::IsOk((Tester *)&local_1b8,(Status *)local_1f8);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x391);
  std::__cxx11::string::string((string *)&local_220,"d",&local_221);
  local_1d8._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,-0x60);
  DBTest::Put((DBTest *)local_1f8,(string *)this,&local_220);
  test::Tester::IsOk((Tester *)&local_1b8,(Status *)local_1f8);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x392);
  std::__cxx11::string::string((string *)&local_220,"e",&local_221);
  local_1d8._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,-0x60);
  DBTest::Put((DBTest *)local_1f8,(string *)this,&local_220);
  test::Tester::IsOk((Tester *)&local_1b8,(Status *)local_1f8);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  pDVar3 = (this->super_DBTest).db_;
  pLStack_1b0 = (Logger *)0x0;
  local_1b8 = (Env *)0x100;
  iVar4 = (*pDVar3->_vptr_DB[6])(pDVar3,&local_1b8);
  iter = (Iterator *)CONCAT44(extraout_var,iVar4);
  (*iter->_vptr_Iterator[3])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x397);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)&local_1b8,&local_220,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x399);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  pcVar2 = local_1f8 + 0x10;
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct((ulong)local_1f8,-0x60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "b->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)&local_1b8,&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x39b);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)&local_1b8,&local_220,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x39d);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct((ulong)local_1f8,-0x60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "d->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)&local_1b8,&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x39f);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct((ulong)local_1f8,-0x60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "e->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)&local_1b8,&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a1);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)&local_1b8,&local_220,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[4])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a4);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct((ulong)local_1f8,-0x60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "e->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)&local_1b8,&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a6);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct((ulong)local_1f8,-0x60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "d->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)&local_1b8,&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a8);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)&local_1b8,&local_220,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3aa);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct((ulong)local_1f8,-0x60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "b->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)&local_1b8,&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3ac);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)&local_1b8,&local_220,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3ae);
  DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)&local_1b8,&local_220,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_220);
  test::Tester::~Tester((Tester *)&local_1b8);
  (*iter->_vptr_Iterator[1])(iter);
  return;
}

Assistant:

TEST(DBTest, IterSmallAndLargeMix) {
  ASSERT_OK(Put("a", "va"));
  ASSERT_OK(Put("b", std::string(100000, 'b')));
  ASSERT_OK(Put("c", "vc"));
  ASSERT_OK(Put("d", std::string(100000, 'd')));
  ASSERT_OK(Put("e", std::string(100000, 'e')));

  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->" + std::string(100000, 'b'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "d->" + std::string(100000, 'd'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "e->" + std::string(100000, 'e'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "e->" + std::string(100000, 'e'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "d->" + std::string(100000, 'd'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->" + std::string(100000, 'b'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}